

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslScanContext.cpp
# Opt level: O3

EHlslTokenClass __thiscall
glslang::HlslScanContext::tokenizeClass(HlslScanContext *this,HlslToken *token)

{
  TSourceLoc *pTVar1;
  HlslToken *pHVar2;
  int iVar3;
  EHlslTokenClass EVar4;
  TPoolAllocator *this_00;
  TString *this_01;
  pool_allocator<char> *ppVar5;
  char *pcVar6;
  TParseContextBase *pTVar7;
  _func_int **pp_Var8;
  char buf [2];
  pool_allocator<char> local_470;
  TPpToken local_468;
  
  this->parserToken = token;
  local_468.space = false;
  local_468.fullyExpanded = false;
  local_468.field_3 = (anon_union_8_3_7104ca99_for_TPpToken_3)0x0;
  local_468.loc.name = (TString *)0x0;
  local_468.loc.string = 0;
  local_468.loc.line = 0;
  local_468.loc.column = 0;
  local_468.name[0] = '\0';
  iVar3 = TPpContext::tokenize(this->ppContext,&local_468);
  if (iVar3 != -1) {
    pTVar1 = &this->loc;
    do {
      this->tokenText = local_468.name;
      *(ulong *)&(this->loc).column = CONCAT44(local_468.loc._20_4_,local_468.loc.column);
      pTVar1->name = local_468.loc.name;
      (this->loc).string = local_468.loc.string;
      (this->loc).line = local_468.loc.line;
      pHVar2 = this->parserToken;
      *(ulong *)&(pHVar2->loc).column = CONCAT44(local_468.loc._20_4_,local_468.loc.column);
      *(undefined4 *)&(pHVar2->loc).name = local_468.loc.name._0_4_;
      *(undefined4 *)((long)&(pHVar2->loc).name + 4) = local_468.loc.name._4_4_;
      (pHVar2->loc).string = local_468.loc.string;
      (pHVar2->loc).line = local_468.loc.line;
      switch(iVar3) {
      case 0x21:
        return EHTokBang;
      default:
        if (iVar3 < 0x7f) {
          local_470.allocator._0_2_ = (ushort)(byte)iVar3;
          pTVar7 = this->parseContext;
          pp_Var8 = (pTVar7->super_TParseVersions)._vptr_TParseVersions;
          pcVar6 = "unexpected token";
          ppVar5 = &local_470;
          goto LAB_004487b0;
        }
        pcVar6 = this->tokenText;
        if (*pcVar6 == '\0') {
          pcVar6 = "";
        }
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2d])
                  (this->parseContext,pTVar1,"unexpected token",pcVar6,"");
        break;
      case 0x25:
        return EHTokPercent;
      case 0x26:
        return EHTokAmpersand;
      case 0x28:
        return EHTokLeftParen;
      case 0x29:
        return EHTokRightParen;
      case 0x2a:
        return EHTokStar;
      case 0x2b:
        return EHTokPlus;
      case 0x2c:
        return EHTokComma;
      case 0x2d:
        return EHTokDash;
      case 0x2e:
        return EHTokDot;
      case 0x2f:
        return EHTokSlash;
      case 0x3a:
        return EHTokColon;
      case 0x3b:
        return EHTokSemicolon;
      case 0x3c:
        return EHTokLeftAngle;
      case 0x3d:
        return EHTokAssign;
      case 0x3e:
        return EHTokRightAngle;
      case 0x3f:
        return EHTokQuestion;
      case 0x5b:
        return EHTokLeftBracket;
      case 0x5c:
        pTVar7 = this->parseContext;
        pp_Var8 = (pTVar7->super_TParseVersions)._vptr_TParseVersions;
        pcVar6 = "illegal use of escape character";
        ppVar5 = (pool_allocator<char> *)0x73beec;
LAB_004487b0:
        (*pp_Var8[0x2d])(pTVar7,pTVar1,pcVar6,ppVar5,"");
        break;
      case 0x5d:
        return EHTokRightBracket;
      case 0x5e:
        return EHTokCaret;
      case 0x7b:
        return EHTokLeftBrace;
      case 0x7c:
        return EHTokVerticalBar;
      case 0x7d:
        return EHTokRightBrace;
      case 0x7e:
        return EHTokTilde;
      case 0x81:
        return EHTokAddAssign;
      case 0x82:
        return EHTokSubAssign;
      case 0x83:
        return EHTokMulAssign;
      case 0x84:
        return EHTokDivAssign;
      case 0x85:
        return EHTokModAssign;
      case 0x86:
        return EHTokRightOp;
      case 0x87:
        return EHTokLeftOp;
      case 0x88:
        return EHTokRightAssign;
      case 0x89:
        return EHTokLeftAssign;
      case 0x8a:
        return EHTokAndAssign;
      case 0x8b:
        return EHTokOrAssign;
      case 0x8c:
        return EHTokXorAssign;
      case 0x8d:
        return EHTokAndOp;
      case 0x8e:
        return EHTokOrOp;
      case 0x8f:
        return EHTokXorOp;
      case 0x90:
        return EHTokEqOp;
      case 0x91:
        return EHTokNeOp;
      case 0x92:
        return EHTokGeOp;
      case 0x93:
        return EHTokLeOp;
      case 0x94:
        return EHTokDecOp;
      case 0x95:
        return EHTokIncOp;
      case 0x96:
        return EHTokColonColon;
      case 0x98:
        (this->parserToken->field_2).i = local_468.field_3.ival;
        return EHTokIntConstant;
      case 0x99:
        (this->parserToken->field_2).i = local_468.field_3.ival;
        return EHTokUintConstant;
      case 0x9e:
        this->parserToken->field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)local_468.field_3;
        return EHTokFloatConstant;
      case 0x9f:
        this->parserToken->field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)local_468.field_3;
        return EHTokDoubleConstant;
      case 0xa0:
        this->parserToken->field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)local_468.field_3;
        return EHTokFloat16Constant;
      case 0xa1:
        pcVar6 = this->tokenText;
        this_00 = GetThreadPoolAllocator();
        this_01 = (TString *)TPoolAllocator::allocate(this_00,0x28);
        local_470.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   this_01,pcVar6,&local_470);
        (this->parserToken->field_2).string = this_01;
        return EHTokStringConstant;
      case 0xa2:
        EVar4 = tokenizeIdentifier(this);
        return EVar4;
      }
      this->parserToken = token;
      local_468.space = false;
      local_468.fullyExpanded = false;
      local_468.field_3 = (anon_union_8_3_7104ca99_for_TPpToken_3)0x0;
      local_468.loc.name = (TString *)0x0;
      local_468.loc.string = 0;
      local_468.loc.line = 0;
      local_468.loc.column = 0;
      local_468.name[0] = '\0';
      iVar3 = TPpContext::tokenize(this->ppContext,&local_468);
    } while (iVar3 != -1);
  }
  return EHTokNone;
}

Assistant:

EHlslTokenClass HlslScanContext::tokenizeClass(HlslToken& token)
{
    do {
        parserToken = &token;
        TPpToken ppToken;
        int token = ppContext.tokenize(ppToken);
        if (token == EndOfInput)
            return EHTokNone;

        tokenText = ppToken.name;
        loc = ppToken.loc;
        parserToken->loc = loc;
        switch (token) {
        case ';':                       return EHTokSemicolon;
        case ',':                       return EHTokComma;
        case ':':                       return EHTokColon;
        case '=':                       return EHTokAssign;
        case '(':                       return EHTokLeftParen;
        case ')':                       return EHTokRightParen;
        case '.':                       return EHTokDot;
        case '!':                       return EHTokBang;
        case '-':                       return EHTokDash;
        case '~':                       return EHTokTilde;
        case '+':                       return EHTokPlus;
        case '*':                       return EHTokStar;
        case '/':                       return EHTokSlash;
        case '%':                       return EHTokPercent;
        case '<':                       return EHTokLeftAngle;
        case '>':                       return EHTokRightAngle;
        case '|':                       return EHTokVerticalBar;
        case '^':                       return EHTokCaret;
        case '&':                       return EHTokAmpersand;
        case '?':                       return EHTokQuestion;
        case '[':                       return EHTokLeftBracket;
        case ']':                       return EHTokRightBracket;
        case '{':                       return EHTokLeftBrace;
        case '}':                       return EHTokRightBrace;
        case '\\':
            parseContext.error(loc, "illegal use of escape character", "\\", "");
            break;

        case PPAtomAddAssign:          return EHTokAddAssign;
        case PPAtomSubAssign:          return EHTokSubAssign;
        case PPAtomMulAssign:          return EHTokMulAssign;
        case PPAtomDivAssign:          return EHTokDivAssign;
        case PPAtomModAssign:          return EHTokModAssign;

        case PpAtomRight:              return EHTokRightOp;
        case PpAtomLeft:               return EHTokLeftOp;

        case PpAtomRightAssign:        return EHTokRightAssign;
        case PpAtomLeftAssign:         return EHTokLeftAssign;
        case PpAtomAndAssign:          return EHTokAndAssign;
        case PpAtomOrAssign:           return EHTokOrAssign;
        case PpAtomXorAssign:          return EHTokXorAssign;

        case PpAtomAnd:                return EHTokAndOp;
        case PpAtomOr:                 return EHTokOrOp;
        case PpAtomXor:                return EHTokXorOp;

        case PpAtomEQ:                 return EHTokEqOp;
        case PpAtomGE:                 return EHTokGeOp;
        case PpAtomNE:                 return EHTokNeOp;
        case PpAtomLE:                 return EHTokLeOp;

        case PpAtomDecrement:          return EHTokDecOp;
        case PpAtomIncrement:          return EHTokIncOp;

        case PpAtomColonColon:         return EHTokColonColon;

        case PpAtomConstInt:           parserToken->i = ppToken.ival;       return EHTokIntConstant;
        case PpAtomConstUint:          parserToken->i = ppToken.ival;       return EHTokUintConstant;
        case PpAtomConstFloat16:       parserToken->d = ppToken.dval;       return EHTokFloat16Constant;
        case PpAtomConstFloat:         parserToken->d = ppToken.dval;       return EHTokFloatConstant;
        case PpAtomConstDouble:        parserToken->d = ppToken.dval;       return EHTokDoubleConstant;
        case PpAtomIdentifier:
        {
            EHlslTokenClass token = tokenizeIdentifier();
            return token;
        }

        case PpAtomConstString: {
            parserToken->string = NewPoolTString(tokenText);
            return EHTokStringConstant;
        }

        case EndOfInput:               return EHTokNone;

        default:
            if (token < PpAtomMaxSingle) {
                char buf[2];
                buf[0] = (char)token;
                buf[1] = 0;
                parseContext.error(loc, "unexpected token", buf, "");
            } else if (tokenText[0] != 0)
                parseContext.error(loc, "unexpected token", tokenText, "");
            else
                parseContext.error(loc, "unexpected token", "", "");
            break;
        }
    } while (true);
}